

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdialogbuttonbox.cpp
# Opt level: O3

void __thiscall QDialogButtonBoxPrivate::layoutButtons(QDialogButtonBoxPrivate *this)

{
  bool bVar1;
  QWidget *this_00;
  ulong originalLength;
  qsizetype qVar2;
  QWidget *second;
  byte bVar3;
  Data *pDVar4;
  bool bVar5;
  int iVar6;
  uint uVar7;
  CutResult CVar8;
  int iVar9;
  long *plVar10;
  QWidget *pQVar11;
  uint *puVar12;
  QWidget **__dest;
  iterator iVar13;
  iterator iVar14;
  long lVar15;
  QList<QAbstractButton_*> *buttonList;
  ButtonLayout BVar16;
  uint uVar17;
  long in_FS_OFFSET;
  qsizetype p;
  QList<QWidget_*> local_68;
  qsizetype local_48;
  QWidget *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
  bVar1 = this->ignoreShowAndHide;
  this->ignoreShowAndHide = true;
  iVar6 = (**(code **)(*(long *)&this->buttonLayout->super_QLayout + 200))();
  if (0 < iVar6) {
    uVar17 = iVar6 + 1;
    do {
      plVar10 = (long *)(**(code **)(*(long *)&this->buttonLayout->super_QLayout + 0xb0))
                                  (this->buttonLayout,uVar17 - 2);
      pQVar11 = (QWidget *)(**(code **)(*plVar10 + 0x68))(plVar10);
      if (pQVar11 != (QWidget *)0x0) {
        QWidget::hide(pQVar11);
      }
      (**(code **)(*plVar10 + 8))(plVar10);
      uVar17 = uVar17 - 1;
    } while (1 < uVar17);
  }
  BVar16 = this->layoutPolicy;
  if (BVar16 == MacLayout) {
    lVar15 = 0;
    do {
      if (this->buttonLists[*(int *)((long)layoutButtons::ModalRoles + lVar15)].d.size != 0) {
        BVar16 = MacLayout;
        goto LAB_0046deb5;
      }
      lVar15 = lVar15 + 4;
    } while (lVar15 != 0x14);
    BVar16 = AndroidLayout;
  }
LAB_0046deb5:
  puVar12 = (uint *)QPlatformDialogHelper::buttonLayout(this->orientation,BVar16);
  if (this->center == true) {
    QBoxLayout::addStretch(this->buttonLayout,0);
  }
  uVar17 = *puVar12;
  if (uVar17 != 0xffffffff) {
    do {
      puVar12 = puVar12 + 1;
      uVar7 = uVar17 & 0xbfffffff;
      bVar3 = (byte)(uVar17 >> 0x18);
      switch(uVar7) {
      case 0:
        if (this->buttonLists[0].d.size != 0) {
          pQVar11 = &(*this->buttonLists[0].d.ptr)->super_QWidget;
          QBoxLayout::addWidget(this->buttonLayout,pQVar11,0,(Alignment)0x0);
          QWidget::show(pQVar11);
        }
        break;
      case 1:
      case 3:
      case 4:
      case 5:
      case 6:
      case 7:
      case 8:
        buttonList = this->buttonLists + uVar7;
LAB_0046df40:
        addButtonsToLayout(this,buttonList,(bool)(bVar3 >> 6 & 1));
        break;
      case 2:
        buttonList = this->buttonLists + 2;
        if (BVar16 != MacLayout) goto LAB_0046df40;
        if ((this->buttonLists[2].d.size != 0) &&
           (iVar6 = (**(code **)(*(long *)&this->buttonLayout->super_QLayout + 200))(), 1 < iVar6))
        {
          QBoxLayout::addSpacing(this->buttonLayout,0x1c);
        }
        addButtonsToLayout(this,this->buttonLists + 2,(bool)(bVar3 >> 6 & 1));
        if (this->buttonLists[2].d.size != 0) {
          QBoxLayout::addSpacing(this->buttonLayout,0x1c);
        }
        break;
      default:
        if (uVar7 == 0x10000000) {
          originalLength = this->buttonLists[0].d.size;
          if (1 < originalLength) {
            local_40 = (QWidget *)0x1;
            local_48 = -1;
            CVar8 = QtPrivate::QContainerImplHelper::mid
                              (originalLength,(qsizetype *)&local_40,&local_48);
            if (CVar8 < Full) {
              local_68.d.d = (Data *)0x0;
              local_68.d.ptr = (QWidget **)0x0;
              local_68.d.size = 0;
LAB_0046e007:
              addButtonsToLayout(this,(QList<QAbstractButton_*> *)&local_68,(bool)(bVar3 >> 6 & 1));
            }
            else {
              if (CVar8 == Full) {
                local_68.d.d = (Data *)this->buttonLists[0].d.d;
                local_68.d.ptr = (QWidget **)this->buttonLists[0].d.ptr;
                local_68.d.size = this->buttonLists[0].d.size;
                if ((QArrayData *)local_68.d.d != (QArrayData *)0x0) {
                  LOCK();
                  (((QArrayData *)&((QArrayData *)local_68.d.d)->ref_)->ref_)._q_value.
                  super___atomic_base<int>._M_i =
                       (((QArrayData *)&((QArrayData *)local_68.d.d)->ref_)->ref_)._q_value.
                       super___atomic_base<int>._M_i + 1;
                  UNLOCK();
                }
              }
              else {
                local_68.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
                __dest = (QWidget **)
                         QArrayData::allocate((QArrayData **)&local_68,8,0x10,local_48,KeepSize);
                qVar2 = local_48;
                pDVar4 = local_68.d.d;
                if (local_48 != 0) {
                  memcpy(__dest,this->buttonLists[0].d.ptr + (long)local_40,local_48 * 8);
                }
                local_68.d.size = qVar2;
                local_68.d.d = pDVar4;
                local_68.d.ptr = __dest;
                if (&pDVar4->super_QArrayData == (QArrayData *)0x0) goto LAB_0046e007;
                LOCK();
                (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                     (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
                UNLOCK();
                LOCK();
                (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                     (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
                UNLOCK();
                if ((pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
                  QArrayData::deallocate(&pDVar4->super_QArrayData,8,0x10);
                }
              }
              pDVar4 = local_68.d.d;
              addButtonsToLayout(this,(QList<QAbstractButton_*> *)&local_68,(bool)(bVar3 >> 6 & 1));
              if (&pDVar4->super_QArrayData != (QArrayData *)0x0) {
                LOCK();
                (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                     (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
                UNLOCK();
                if ((pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
                  QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,8,0x10);
                }
              }
            }
          }
        }
        else if ((uVar7 == 0x20000000) && (this->center == false)) {
          QBoxLayout::addStretch(this->buttonLayout,0);
        }
      }
      uVar17 = *puVar12;
    } while (uVar17 != 0xffffffff);
  }
  local_68.d.d = (Data *)0x0;
  local_68.d.ptr = (QWidget **)0x0;
  local_68.d.size = 0;
  iVar6 = (**(code **)(*(long *)&this->buttonLayout->super_QLayout + 200))();
  if (0 < iVar6) {
    iVar6 = 0;
    do {
      plVar10 = (long *)(**(code **)(*(long *)&this->buttonLayout->super_QLayout + 0xa8))();
      pQVar11 = (QWidget *)(**(code **)(*plVar10 + 0x68))(plVar10);
      if (pQVar11 != (QWidget *)0x0) {
        local_40 = pQVar11;
        QtPrivate::QPodArrayOps<QWidget*>::emplace<QWidget*&>
                  ((QPodArrayOps<QWidget*> *)&local_68,local_68.d.size,&local_40);
        QList<QWidget_*>::end(&local_68);
      }
      iVar6 = iVar6 + 1;
      iVar9 = (**(code **)(*(long *)&this->buttonLayout->super_QLayout + 200))();
    } while (iVar6 < iVar9);
  }
  QWidget::setFocusProxy(this_00,(QWidget *)0x0);
  if (local_68.d.size != 0) {
    pQVar11 = local_68.d.ptr[local_68.d.size + -1];
    iVar13 = QList<QWidget_*>::begin(&local_68);
    iVar14 = QList<QWidget_*>::end(&local_68);
    for (; iVar13.i != iVar14.i; iVar13.i = iVar13.i + 1) {
      second = *iVar13.i;
      QWidget::setTabOrder(pQVar11,second);
      pQVar11 = (QWidget *)QMetaObject::cast((QObject *)&QPushButton::staticMetaObject);
      if ((pQVar11 != (QWidget *)0x0) &&
         (bVar5 = QPushButton::isDefault((QPushButton *)pQVar11), bVar5)) {
        QWidget::setFocusProxy(this_00,pQVar11);
      }
      pQVar11 = second;
    }
  }
  if (this->center == true) {
    QBoxLayout::addStretch(this->buttonLayout,0);
  }
  if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,8,0x10);
    }
  }
  this->ignoreShowAndHide = bVar1;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDialogButtonBoxPrivate::layoutButtons()
{
    Q_Q(QDialogButtonBox);
    const int MacGap = 36 - 8;    // 8 is the default gap between a widget and a spacer item

    QScopedValueRollback blocker(ignoreShowAndHide, true);
    for (int i = buttonLayout->count() - 1; i >= 0; --i) {
        QLayoutItem *item = buttonLayout->takeAt(i);
        if (QWidget *widget = item->widget())
            widget->hide();
        delete item;
    }

    int tmpPolicy = layoutPolicy;

    static const int M = 5;
    static const int ModalRoles[M] = { QPlatformDialogHelper::AcceptRole, QPlatformDialogHelper::RejectRole,
        QPlatformDialogHelper::DestructiveRole, QPlatformDialogHelper::YesRole, QPlatformDialogHelper::NoRole };
    if (tmpPolicy == QDialogButtonBox::MacLayout) {
        bool hasModalButton = false;
        for (int i = 0; i < M; ++i) {
            if (!buttonLists[ModalRoles[i]].isEmpty()) {
                hasModalButton = true;
                break;
            }
        }
        if (!hasModalButton)
            tmpPolicy = 4;  // Mac modeless
    }

    const int *currentLayout = QPlatformDialogHelper::buttonLayout(
        orientation, static_cast<QPlatformDialogHelper::ButtonLayout>(tmpPolicy));

    if (center)
        buttonLayout->addStretch();

    const QList<QAbstractButton *> &acceptRoleList = buttonLists[QPlatformDialogHelper::AcceptRole];

    while (*currentLayout != QPlatformDialogHelper::EOL) {
        int role = (*currentLayout & ~QPlatformDialogHelper::Reverse);
        bool reverse = (*currentLayout & QPlatformDialogHelper::Reverse);

        switch (role) {
        case QPlatformDialogHelper::Stretch:
            if (!center)
                buttonLayout->addStretch();
            break;
        case QPlatformDialogHelper::AcceptRole: {
            if (acceptRoleList.isEmpty())
                break;
            // Only the first one
            QAbstractButton *button = acceptRoleList.first();
            buttonLayout->addWidget(button);
            button->show();
        }
            break;
        case QPlatformDialogHelper::AlternateRole:
            if (acceptRoleList.size() > 1)
                addButtonsToLayout(acceptRoleList.mid(1), reverse);
            break;
        case QPlatformDialogHelper::DestructiveRole:
            {
                const QList<QAbstractButton *> &list = buttonLists[role];

                /*
                    Mac: Insert a gap on the left of the destructive
                    buttons to ensure that they don't get too close to
                    the help and action buttons (but only if there are
                    some buttons to the left of the destructive buttons
                    (and the stretch, whence buttonLayout->count() > 1
                    and not 0)).
                */
                if (tmpPolicy == QDialogButtonBox::MacLayout
                        && !list.isEmpty() && buttonLayout->count() > 1)
                    buttonLayout->addSpacing(MacGap);

                addButtonsToLayout(list, reverse);

                /*
                    Insert a gap between the destructive buttons and the
                    accept and reject buttons.
                */
                if (tmpPolicy == QDialogButtonBox::MacLayout && !list.isEmpty())
                    buttonLayout->addSpacing(MacGap);
            }
            break;
        case QPlatformDialogHelper::RejectRole:
        case QPlatformDialogHelper::ActionRole:
        case QPlatformDialogHelper::HelpRole:
        case QPlatformDialogHelper::YesRole:
        case QPlatformDialogHelper::NoRole:
        case QPlatformDialogHelper::ApplyRole:
        case QPlatformDialogHelper::ResetRole:
            addButtonsToLayout(buttonLists[role], reverse);
        }
        ++currentLayout;
    }

    QWidgetList layoutWidgets;
    for (int i = 0; i < buttonLayout->count(); ++i) {
        if (auto *widget = buttonLayout->itemAt(i)->widget())
            layoutWidgets << widget;
    }

    q->setFocusProxy(nullptr);
    if (!layoutWidgets.isEmpty()) {
        QWidget *prev = layoutWidgets.constLast();
        for (QWidget *here : layoutWidgets) {
            QWidget::setTabOrder(prev, here);
            prev = here;
            if (auto *pushButton = qobject_cast<QPushButton *>(prev); pushButton && pushButton->isDefault())
                q->setFocusProxy(pushButton);
        }
    }

    if (center)
        buttonLayout->addStretch();
}